

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

void __thiscall
pbrt::PMJ02BNSampler::PMJ02BNSampler(PMJ02BNSampler *this,int samplesPerPixel,Allocator alloc)

{
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *pvVar1;
  
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  this->sampleIndex = 0;
  this->dimension = 0;
  this->samplesPerPixel = samplesPerPixel;
  if (1 << (~(byte)LZCOUNT(samplesPerPixel) & 0x1e) != samplesPerPixel) {
    Warning<>(
             "PMJ02BNSampler results are best with power-of-4 samples per pixel (1, 4, 16, 64, ...)"
             );
  }
  pvVar1 = GetSortedPMJ02BNPixelSamples(samplesPerPixel,alloc,&this->pixelTileSize);
  this->pixelSamples = pvVar1;
  return;
}

Assistant:

PMJ02BNSampler::PMJ02BNSampler(int samplesPerPixel, Allocator alloc)
    : samplesPerPixel(samplesPerPixel) {
    if (!IsPowerOf4(samplesPerPixel))
        Warning("PMJ02BNSampler results are best with power-of-4 samples per "
                "pixel (1, 4, 16, 64, ...)");
    pixelSamples = GetSortedPMJ02BNPixelSamples(samplesPerPixel, alloc, &pixelTileSize);
}